

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# okim6258.c
# Opt level: O2

void okim6258_update(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  DEV_SMPL *pDVar1;
  DEV_SMPL *pDVar2;
  ushort uVar3;
  byte bVar4;
  ushort uVar5;
  int iVar6;
  byte bVar7;
  ulong uVar8;
  byte bVar9;
  short sVar10;
  undefined2 uVar11;
  uint uVar12;
  int iVar13;
  
  pDVar1 = *outputs;
  pDVar2 = outputs[1];
  if (((*(byte *)((long)param + 8) & 2) == 0) || (*(char *)((long)param + 0x38) != '\0')) {
    for (uVar8 = 0; samples != uVar8; uVar8 = uVar8 + 1) {
      pDVar1[uVar8] = 0;
      pDVar2[uVar8] = 0;
    }
  }
  else {
    bVar7 = *(byte *)((long)param + 0x17);
    for (uVar8 = 0; samples != uVar8; uVar8 = uVar8 + 1) {
      bVar4 = *(byte *)((long)param + 0x2a);
      if (bVar7 == 0) {
        if (bVar4 == 0) {
          bVar4 = *(byte *)((long)param + 0x29) + 0x10;
          *(undefined1 *)((long)param + 0x16) =
               *(undefined1 *)((long)param + (ulong)(*(byte *)((long)param + 0x29) >> 4) + 0x20);
          bVar9 = bVar4 & 0x7f;
          *(byte *)((long)param + 0x29) = bVar9;
          if (bVar9 >> 4 == (bVar4 & 0xf)) {
            *(undefined1 *)((long)param + 0x2a) = 1;
          }
          goto LAB_00158b51;
        }
        if (-1 < (char)bVar4) {
          bVar4 = bVar4 + 1;
          *(byte *)((long)param + 0x2a) = bVar4;
          goto LAB_00158bdf;
        }
LAB_00158be9:
        *(byte *)((long)param + 0x2a) = bVar4 - 1;
        uVar5 = (ushort)((long)(*(short *)((long)param + 0x1c) * 0xf) / 0x10);
        *(ushort *)((long)param + 0x1c) = uVar5;
LAB_00158bfc:
        *(ushort *)((long)param + 0x2c) = uVar5;
      }
      else {
        if (bVar4 < 2) {
LAB_00158b51:
          uVar12 = (uint)(*(byte *)((long)param + 0x16) >> (bVar7 & 0x1f));
          uVar5 = (short)((uint)(*(short *)((long)param + 0x1c) * 0xf5) >> 8) +
                  (short)diff_lookup[(int)((int)*(short *)((long)param + 0x1e) << 4 | uVar12 & 0xf)]
          ;
          *(ushort *)((long)param + 0x1c) = uVar5;
          uVar3 = 0x7ff;
          if ((0x7ff < (short)uVar5) || (uVar3 = 0xf800, (short)uVar5 < -0x800)) {
            uVar5 = uVar3;
            *(ushort *)((long)param + 0x1c) = uVar5;
          }
          sVar10 = *(short *)((long)param + 0x1e) + (short)index_shift[uVar12 & 7];
          *(short *)((long)param + 0x1e) = sVar10;
          uVar11 = 0x30;
          if (sVar10 < 0x31) {
            if (-1 < sVar10) goto LAB_00158bfc;
            uVar11 = 0;
          }
          *(undefined2 *)((long)param + 0x1e) = uVar11;
          goto LAB_00158bfc;
        }
LAB_00158bdf:
        if (bVar4 != 2) goto LAB_00158be9;
        uVar5 = *(ushort *)((long)param + 0x2c);
      }
      bVar7 = bVar7 ^ 4;
      bVar4 = *(byte *)((long)param + 0x2b);
      iVar6 = (int)(short)((uVar5 & *(ushort *)((long)param + 0x1a)) << 4);
      iVar13 = 0;
      if ((bVar4 & 2) == 0) {
        iVar13 = iVar6;
      }
      pDVar1[uVar8] = iVar13;
      if ((bVar4 & 1) != 0) {
        iVar6 = 0;
      }
      pDVar2[uVar8] = iVar6;
    }
    *(byte *)((long)param + 0x17) = bVar7;
  }
  return;
}

Assistant:

static void okim6258_update(void *param, UINT32 samples, DEV_SMPL **outputs)
{
	okim6258_state *chip = (okim6258_state *)param;
	DEV_SMPL *bufL = outputs[0];
	DEV_SMPL *bufR = outputs[1];
	UINT32 i;

	if ((chip->status & STATUS_PLAYING) && ! chip->Muted)
	{
		UINT8 nibble_shift = chip->nibble_shift;

		for (i = 0; i < samples; i++)
		{
			/* Compute the new amplitude and update the current step */
			int nibble;
			INT16 sample;
			
			if (! nibble_shift)
			{
				// 1st nibble - get data
				if (! chip->data_empty)
				{
					chip->data_in = chip->data_buf[chip->data_buf_pos >> 4];
					chip->data_buf_pos += 0x10;
					chip->data_buf_pos &= 0x7F;
					if ((chip->data_buf_pos >> 4) == (chip->data_buf_pos & 0x0F))
						chip->data_empty ++;
				}
				else
				{
					//chip->data_in = chip->data_in_last;
					if (chip->data_empty < 0x80)
						chip->data_empty ++;
				}
			}
			nibble = (chip->data_in >> nibble_shift) & 0xf;

			/* Output to the buffer */
			//sample = clock_adpcm(chip, nibble);
			if (chip->data_empty < 0x02)
			{
				sample = clock_adpcm(chip, nibble);
				chip->last_smpl = sample;
			}
			else
			{
				// Valley Bell: data_empty behaviour (loosely) ported from XM6
				if (chip->data_empty >= 0x02 + 0x01)
				{
					chip->data_empty -= 0x01;
					chip->signal = chip->signal * 15 / 16;
					chip->last_smpl = chip->signal;
				}
				sample = chip->last_smpl;
			}

			nibble_shift ^= 4;

			sample &= chip->output_mask;	// emulate DAC precision
			sample <<= 4;	// scale up to 16 bit
			bufL[i] = (chip->pan & 0x02) ? 0 : sample;
			bufR[i] = (chip->pan & 0x01) ? 0 : sample;
		}

		/* Update the parameters */
		chip->nibble_shift = nibble_shift;
	}
	else
	{
		/* Fill with 0 */
		for (i = 0; i < samples; i++)
		{
			bufL[i] = 0;
			bufR[i] = 0;
		}
	}
}